

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_bnd.c
# Opt level: O0

void PrintOutput(N_Vector u)

{
  long lVar1;
  undefined8 in_RDI;
  sunrealtype *udata;
  sunrealtype y;
  sunrealtype x;
  sunrealtype dy;
  sunrealtype dx;
  int j;
  int i;
  int local_10;
  int local_c;
  
  lVar1 = N_VGetArrayPointer(in_RDI);
  printf("            ");
  for (local_c = 1; local_c < 0x20; local_c = local_c + 3) {
    printf("%-8.5f ",(double)local_c * 0.03125);
  }
  printf("\n\n");
  for (local_10 = 1; local_10 < 0x20; local_10 = local_10 + 3) {
    printf("%-8.5f    ",(double)local_10 * 0.03125);
    for (local_c = 1; local_c < 0x20; local_c = local_c + 3) {
      printf("%-8.5f ",*(undefined8 *)(lVar1 + (long)(local_10 + -1 + (local_c + -1) * 0x1f) * 8));
    }
    printf("\n");
  }
  return;
}

Assistant:

static void PrintOutput(N_Vector u)
{
  int i, j;
  sunrealtype dx, dy, x, y;
  sunrealtype* udata;

  dx = ONE / (NX + 1);
  dy = ONE / (NY + 1);

  udata = N_VGetArrayPointer(u);

  printf("            ");
  for (i = 1; i <= NX; i += SKIP)
  {
    x = i * dx;
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("%-8.5Lf ", x);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("%-8.5f ", x);
#else
    printf("%-8.5f ", x);
#endif
  }
  printf("\n\n");

  for (j = 1; j <= NY; j += SKIP)
  {
    y = j * dy;
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("%-8.5Lf    ", y);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("%-8.5f    ", y);
#else
    printf("%-8.5f    ", y);
#endif
    for (i = 1; i <= NX; i += SKIP)
    {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      printf("%-8.5Lf ", IJth(udata, i, j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      printf("%-8.5f ", IJth(udata, i, j));
#else
      printf("%-8.5f ", IJth(udata, i, j));
#endif
    }
    printf("\n");
  }
}